

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

t_object * xemmai::t_map::f_instantiate(void)

{
  t_object *ptVar1;
  long in_FS_OFFSET;
  t_type_of<xemmai::t_object> *local_8;
  
  local_8 = *(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1c8);
  ptVar1 = t_type_of<xemmai::t_object>::f_new<xemmai::t_map,xemmai::t_type_of<xemmai::t_object>*>
                     (*(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1d8),
                      &local_8);
  return ptVar1;
}

Assistant:

t_object* t_map::f_instantiate()
{
	auto global = f_global();
	return f_new<t_map>(global, global->f_type<t_map::t_table>());
}